

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void fl_clipboard_notify_change(void)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = fl_clipboard_notify_empty();
  if (bVar1) {
    primary_timestamp = 0xffffffffffffffff;
    clipboard_timestamp = 0xffffffffffffffff;
  }
  else if (have_xfixes == '\0') {
    poll_clipboard_owner();
    iVar2 = Fl::has_timeout(clipboard_timeout,(void *)0x0);
    if (iVar2 == 0) {
      Fl::add_timeout(0.5,clipboard_timeout,(void *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void fl_clipboard_notify_change() {
  // Reset the timestamps if we've going idle so that you don't
  // get a bogus immediate trigger next time they're activated.
  if (fl_clipboard_notify_empty()) {
    primary_timestamp = (Time)-1;
    clipboard_timestamp = (Time)-1;
  } else {
#if HAVE_XFIXES
    if (!have_xfixes)
#endif
    {
      poll_clipboard_owner();

      if (!Fl::has_timeout(clipboard_timeout))
        Fl::add_timeout(0.5, clipboard_timeout);
    }
  }
}